

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O0

void __thiscall OPL_RDOSdump::WriteReg(OPL_RDOSdump *this,int reg,int v)

{
  uint uVar1;
  undefined1 local_1d;
  undefined1 local_1c;
  char local_1b [3];
  undefined1 auStack_18 [3];
  BYTE cmd [2];
  BYTE switcher [2];
  BYTE chipnum;
  int v_local;
  int reg_local;
  OPL_RDOSdump *this_local;
  
  _auStack_18 = v;
  unique0x10000110 = reg;
  if ((this->super_OPLDump).File != (FILE *)0x0) {
    local_1b[2] = (char)((uint)reg >> 8);
    if (local_1b[2] != (this->super_OPLDump).CurChip) {
      local_1b[0] = local_1b[2] + '\x01';
      local_1b[1] = 2;
      fwrite(local_1b,1,2,(FILE *)(this->super_OPLDump).File);
    }
    uVar1 = stack0xffffffffffffffec & 0xff;
    if (((uVar1 != 0) && (uVar1 != 2)) && ((uVar1 != 0xff || (_auStack_18 != 0xff)))) {
      local_1d = (undefined1)_auStack_18;
      local_1c = (undefined1)stack0xffffffffffffffec;
      unique0x10000104 = uVar1;
      fwrite(&local_1d,1,2,(FILE *)(this->super_OPLDump).File);
    }
    return;
  }
  __assert_fail("File != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/music_opldumper_mididevice.cpp"
                ,0x70,"virtual void OPL_RDOSdump::WriteReg(int, int)");
}

Assistant:

virtual void WriteReg(int reg, int v)
	{
		assert(File != NULL);
		BYTE chipnum = reg >> 8;
		if (chipnum != CurChip)
		{
			BYTE switcher[2] = { (BYTE)(chipnum + 1), 2 };
			fwrite(switcher, 1, 2, File);
		}
		reg &= 255;
		if (reg != 0 && reg != 2 && (reg != 255 || v != 255))
		{
			BYTE cmd[2] = { BYTE(v), BYTE(reg) };
			fwrite(cmd, 1, 2, File);
		}
	}